

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_HANDLE
IoTHubRegistryManager_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)

{
  int iVar1;
  IOTHUB_REGISTRYMANAGER *registryManager;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (serviceClientHandle == (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "serviceClientHandle input parameter cannot be NULL";
    iVar1 = 0x502;
LAB_001352e3:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"IoTHubRegistryManager_Create",iVar1,1,pcVar3);
    return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
  }
  pcVar3 = serviceClientHandle->hostname;
  if (pcVar3 == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "authInfo->hostName input parameter cannot be NULL";
    iVar1 = 0x50b;
    goto LAB_001352e3;
  }
  if (serviceClientHandle->iothubName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "authInfo->iothubName input parameter cannot be NULL";
    iVar1 = 0x510;
    goto LAB_001352e3;
  }
  if (serviceClientHandle->iothubSuffix == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "authInfo->iothubSuffix input parameter cannot be NULL";
    iVar1 = 0x515;
    goto LAB_001352e3;
  }
  if ((serviceClientHandle->keyName == (char *)0x0) &&
     (serviceClientHandle->deviceId == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "authInfo->keyName and authInfo->deviceId input parameter cannot both be NULL";
    iVar1 = 0x51a;
    goto LAB_001352e3;
  }
  if (serviceClientHandle->sharedAccessKey == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "authInfo->sharedAccessKey input parameter cannot be NULL";
    iVar1 = 0x51f;
    goto LAB_001352e3;
  }
  registryManager = (IOTHUB_REGISTRYMANAGER *)calloc(1,0x30);
  if (registryManager == (IOTHUB_REGISTRYMANAGER *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
    }
    pcVar3 = "Malloc failed for IOTHUB_REGISTRYMANAGER";
    iVar1 = 0x527;
    goto LAB_001352e3;
  }
  iVar1 = mallocAndStrcpy_s((char **)registryManager,pcVar3);
  if (iVar1 == 0) {
    iVar1 = mallocAndStrcpy_s(&registryManager->iothubName,serviceClientHandle->iothubName);
    if (iVar1 == 0) {
      iVar1 = mallocAndStrcpy_s(&registryManager->iothubSuffix,serviceClientHandle->iothubSuffix);
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s(&registryManager->sharedAccessKey,
                                  serviceClientHandle->sharedAccessKey);
        if (iVar1 == 0) {
          if ((serviceClientHandle->keyName == (char *)0x0) ||
             (iVar1 = mallocAndStrcpy_s(&registryManager->keyName,serviceClientHandle->keyName),
             iVar1 == 0)) {
            if (serviceClientHandle->deviceId == (char *)0x0) {
              return registryManager;
            }
            iVar1 = mallocAndStrcpy_s(&registryManager->deviceId,serviceClientHandle->deviceId);
            if (iVar1 == 0) {
              return registryManager;
            }
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
            pcVar3 = "mallocAndStrcpy_s failed for deviceId";
            iVar1 = 0x54d;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
            pcVar3 = "mallocAndStrcpy_s failed for keyName";
            iVar1 = 0x547;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
          pcVar3 = "mallocAndStrcpy_s failed for sharedAccessKey";
          iVar1 = 0x541;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
        pcVar3 = "mallocAndStrcpy_s failed for iothubSuffix";
        iVar1 = 0x53b;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
      pcVar3 = "mallocAndStrcpy_s failed for iothubName";
      iVar1 = 0x535;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001353b4;
    pcVar3 = "mallocAndStrcpy_s failed for hostName";
    iVar1 = 0x52f;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_Create",iVar1,1,pcVar3);
LAB_001353b4:
  free_registrymanager_handle(registryManager);
  return (IOTHUB_REGISTRYMANAGER_HANDLE)0x0;
}

Assistant:

IOTHUB_REGISTRYMANAGER_HANDLE IoTHubRegistryManager_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)
{
    IOTHUB_REGISTRYMANAGER_HANDLE result;

    if (serviceClientHandle == NULL)
    {
        LogError("serviceClientHandle input parameter cannot be NULL");
        result = NULL;
    }
    else
    {
        IOTHUB_SERVICE_CLIENT_AUTH* serviceClientAuth = (IOTHUB_SERVICE_CLIENT_AUTH*)serviceClientHandle;

        if (serviceClientAuth->hostname == NULL)
        {
            LogError("authInfo->hostName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubName == NULL)
        {
            LogError("authInfo->iothubName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubSuffix == NULL)
        {
            LogError("authInfo->iothubSuffix input parameter cannot be NULL");
            result = NULL;
        }
        else if ((serviceClientAuth->keyName == NULL) && (serviceClientAuth->deviceId == NULL))
        {
            LogError("authInfo->keyName and authInfo->deviceId input parameter cannot both be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->sharedAccessKey == NULL)
        {
            LogError("authInfo->sharedAccessKey input parameter cannot be NULL");
            result = NULL;
        }
        else
        {
            result = malloc(sizeof(IOTHUB_REGISTRYMANAGER));
            if (result == NULL)
            {
                LogError("Malloc failed for IOTHUB_REGISTRYMANAGER");
            }
            else
            {
                memset(result, 0, sizeof(IOTHUB_REGISTRYMANAGER));

                if (mallocAndStrcpy_s(&result->hostname, serviceClientAuth->hostname) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for hostName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->iothubName, serviceClientAuth->iothubName) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for iothubName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->iothubSuffix, serviceClientAuth->iothubSuffix) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for iothubSuffix");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->sharedAccessKey, serviceClientAuth->sharedAccessKey) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if ((serviceClientAuth->keyName != NULL) && (mallocAndStrcpy_s(&result->keyName, serviceClientAuth->keyName) != 0))
                {
                    LogError("mallocAndStrcpy_s failed for keyName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if ((serviceClientAuth->deviceId != NULL) && (mallocAndStrcpy_s(&result->deviceId, serviceClientAuth->deviceId) != 0))
                {
                    LogError("mallocAndStrcpy_s failed for deviceId");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}